

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O2

void __thiscall
Rml::ElementText::GenerateGeometry
          (ElementText *this,RenderManager *render_manager,FontFaceHandle font_face_handle)

{
  Vector<TexturedGeometry>_conflict *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pTVar3;
  FontEffectsHandle FVar4;
  undefined8 uVar5;
  int iVar6;
  ComputedValues *this_01;
  FontEngineInterface *pFVar7;
  pointer pLVar8;
  size_t i_1;
  long lVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  TexturedMeshList mesh_list;
  TextShapingContext text_shaping_context;
  StringView local_70;
  
  this_01 = Element::GetComputedValues(&this->super_Element);
  text_shaping_context.language = &(this_01->inherited).language;
  text_shaping_context.text_direction =
       (Direction)((uint)*(undefined4 *)&(this_01->inherited).field_0x14 >> 0x1d) & (Rtl|Ltr);
  text_shaping_context.letter_spacing = Style::ComputedValues::letter_spacing(this_01);
  this_00 = &this->geometry;
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::vector
            (&mesh_list,
             (long)(this->geometry).
                   super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->geometry).
                   super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,
             (allocator_type *)&stack0xffffffffffffffa0);
  lVar11 = 0;
  lVar9 = 0;
  for (uVar10 = 0;
      pTVar3 = (this->geometry).
               super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->geometry).
                             super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 5);
      uVar10 = uVar10 + 1) {
    Geometry::Release((Mesh *)&stack0xffffffffffffffa0,
                      (Geometry *)
                      ((long)&(pTVar3->geometry).
                              super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                              .render_manager + lVar11),ClearMesh);
    Mesh::operator=((Mesh *)((long)&((mesh_list.
                                      super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->mesh).vertices.
                                    super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar9),
                    (Mesh *)&stack0xffffffffffffffa0);
    Mesh::~Mesh((Mesh *)&stack0xffffffffffffffa0);
    lVar9 = lVar9 + 0x40;
    lVar11 = lVar11 + 0x20;
  }
  pLVar8 = (this->lines).
           super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar9 = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)(((long)(this->lines).
                              super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar8) / 0x30);
      uVar10 = uVar10 + 1) {
    pFVar7 = GetFontEngineInterface();
    FVar4 = this->font_effects_handle;
    StringView::StringView
              (&local_70,
               (String *)
               ((long)&(((this->lines).
                         super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                         ._M_impl.super__Vector_impl_data._M_start)->text)._M_dataplus._M_p + lVar9)
              );
    iVar6 = (*pFVar7->_vptr_FontEngineInterface[10])
                      ((int)*(undefined8 *)
                             ((long)&(((this->lines).
                                       super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->position).x +
                             lVar9),this->opacity,pFVar7,render_manager,font_face_handle,FVar4,
                       local_70.p_begin,local_70.p_end,(ulong)(uint)this->colour,
                       &text_shaping_context,&mesh_list);
    pLVar8 = (this->lines).
             super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(int *)((long)&pLVar8->width + lVar9) = iVar6;
    lVar9 = lVar9 + 0x30;
  }
  ::std::
  vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>::
  resize(this_00,(long)mesh_list.
                       super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)mesh_list.
                       super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6);
  lVar9 = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)((long)(this->geometry).
                             super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->geometry).
                             super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar10 = uVar10 + 1) {
    RenderManager::MakeGeometry((RenderManager *)&stack0xffffffffffffffa0,(Mesh *)render_manager);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)((long)&(((this_00->
                             super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                             )._M_impl.super__Vector_impl_data._M_start)->geometry).
                           super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                           .render_manager + lVar9),
                (UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)&stack0xffffffffffffffa0);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::~UniqueRenderResource
              ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                *)&stack0xffffffffffffffa0);
    puVar1 = (undefined8 *)
             ((long)&((mesh_list.
                       super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                       _M_impl.super__Vector_impl_data._M_start)->texture).render_manager +
             lVar9 * 2);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)&(((this_00->
                       super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                       )._M_impl.super__Vector_impl_data._M_start)->texture).render_manager + lVar9)
    ;
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar9 = lVar9 + 0x20;
  }
  this->generated_decoration = None;
  this->field_0x1ec = this->field_0x1ec & 0xfe;
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::~vector(&mesh_list);
  return;
}

Assistant:

void ElementText::GenerateGeometry(RenderManager& render_manager, const FontFaceHandle font_face_handle)
{
	RMLUI_ZoneScopedC(0xD2691E);

	const auto& computed = GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	// Release the old geometry, and reuse the mesh buffers.
	TexturedMeshList mesh_list(geometry.size());
	for (size_t i = 0; i < geometry.size(); i++)
		mesh_list[i].mesh = geometry[i].geometry.Release(Geometry::ReleaseMode::ClearMesh);

	// Generate the new geometry, one line at a time.
	for (size_t i = 0; i < lines.size(); ++i)
	{
		lines[i].width = GetFontEngineInterface()->GenerateString(render_manager, font_face_handle, font_effects_handle, lines[i].text,
			lines[i].position, colour, opacity, text_shaping_context, mesh_list);
	}

	// Apply the new geometry and textures.
	geometry.resize(mesh_list.size());
	for (size_t i = 0; i < geometry.size(); i++)
	{
		geometry[i].geometry = render_manager.MakeGeometry(std::move(mesh_list[i].mesh));
		geometry[i].texture = mesh_list[i].texture;
	}

	generated_decoration = Style::TextDecoration::None;
	geometry_dirty = false;
}